

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

TValue * stkindex2adr(lua_State *L,int idx)

{
  TValue *pTVar1;
  
  if (idx < 1) {
    pTVar1 = L->top + idx;
  }
  else {
    pTVar1 = L->base + ((ulong)(uint)idx - 1);
    if (L->top <= pTVar1) {
      return (TValue *)((ulong)(L->glref).ptr32 + 0x68);
    }
  }
  return pTVar1;
}

Assistant:

static TValue *stkindex2adr(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    return o < L->top ? o : niltv(L);
  } else {
    api_check(L, idx != 0 && -idx <= L->top - L->base);
    return L->top + idx;
  }
}